

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O0

NETADDR * __thiscall CServerBrowserFavorites::UpdateFavorites(CServerBrowserFavorites *this)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  int iVar5;
  uint uVar6;
  CFavoriteServer *pCVar7;
  CServerBrowserFavorites *in_RDI;
  int i;
  CFavoriteServer *pEntry;
  NETADDR *pResult;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  CServerBrowserFavorites *in_stack_ffffffffffffffc0;
  IEngine *pIVar8;
  NETADDR *in_stack_ffffffffffffffc8;
  CFavoriteLookup *pCVar9;
  NETADDR *in_stack_ffffffffffffffd0;
  int local_1c;
  NETADDR *local_10;
  
  local_10 = (NETADDR *)0x0;
  if ((((in_RDI->m_FavLookup).m_Active & 1U) != 0) &&
     (iVar5 = CJob::Status((CJob *)&in_RDI->m_FavLookup), iVar5 == 2)) {
    if ((in_RDI->m_FavLookup).m_FavoriteIndex != -1) {
      iVar5 = CJob::Result((CJob *)&in_RDI->m_FavLookup);
      if (iVar5 == 0) {
        pCVar7 = FindFavoriteByAddr(in_RDI,in_stack_ffffffffffffffd0,
                                    (int *)in_stack_ffffffffffffffc8);
        if (pCVar7 == (CFavoriteServer *)0x0) {
          if ((in_RDI->m_aFavoriteServers[(in_RDI->m_FavLookup).m_FavoriteIndex].m_State == 0) ||
             (iVar5 = net_addr_comp(in_stack_ffffffffffffffc8,(NETADDR *)in_stack_ffffffffffffffc0,
                                    in_stack_ffffffffffffffbc), iVar5 == 0)) {
            iVar5 = (in_RDI->m_FavLookup).m_FavoriteIndex;
            uVar1 = (in_RDI->m_FavLookup).m_HostLookup.m_Addr.ip[0];
            uVar2 = (in_RDI->m_FavLookup).m_HostLookup.m_Addr.ip[1];
            uVar3 = (in_RDI->m_FavLookup).m_HostLookup.m_Addr.ip[2];
            uVar4 = (in_RDI->m_FavLookup).m_HostLookup.m_Addr.ip[3];
            pCVar7 = in_RDI->m_aFavoriteServers + iVar5;
            (pCVar7->m_Addr).type = (in_RDI->m_FavLookup).m_HostLookup.m_Addr.type;
            (pCVar7->m_Addr).ip[0] = uVar1;
            (pCVar7->m_Addr).ip[1] = uVar2;
            (pCVar7->m_Addr).ip[2] = uVar3;
            (pCVar7->m_Addr).ip[3] = uVar4;
            *(undefined8 *)(in_RDI->m_aFavoriteServers[iVar5].m_Addr.ip + 4) =
                 *(undefined8 *)((in_RDI->m_FavLookup).m_HostLookup.m_Addr.ip + 4);
            *(undefined8 *)(in_RDI->m_aFavoriteServers[iVar5].m_Addr.ip + 0xc) =
                 *(undefined8 *)((in_RDI->m_FavLookup).m_HostLookup.m_Addr.ip + 0xc);
            in_RDI->m_aFavoriteServers[(in_RDI->m_FavLookup).m_FavoriteIndex].m_State = 4;
            local_10 = &in_RDI->m_aFavoriteServers[(in_RDI->m_FavLookup).m_FavoriteIndex].m_Addr;
          }
          else {
            RemoveFavoriteEntry(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
          }
        }
        else {
          if (pCVar7->m_State != 4) {
            str_copy((char *)in_stack_ffffffffffffffc0,
                     (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
            pCVar7->m_State = 4;
          }
          RemoveFavoriteEntry(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
        }
      }
      else if (in_RDI->m_aFavoriteServers[(in_RDI->m_FavLookup).m_FavoriteIndex].m_State == 0) {
        in_RDI->m_aFavoriteServers[(in_RDI->m_FavLookup).m_FavoriteIndex].m_State = 2;
      }
      else {
        RemoveFavoriteEntry(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      }
    }
    (in_RDI->m_FavLookup).m_Active = false;
  }
  if ((0 < (in_RDI->m_FavLookup).m_LookupCount) && (((in_RDI->m_FavLookup).m_Active & 1U) == 0)) {
    for (local_1c = 0; local_1c < in_RDI->m_NumFavoriteServers; local_1c = local_1c + 1) {
      if (in_RDI->m_aFavoriteServers[local_1c].m_State < 2) {
        pIVar8 = in_RDI->m_pEngine;
        pCVar9 = &in_RDI->m_FavLookup;
        pCVar7 = in_RDI->m_aFavoriteServers + local_1c;
        uVar6 = CNetBase::NetType(&in_RDI->m_pNetClient->super_CNetBase);
        (*(pIVar8->super_IInterface)._vptr_IInterface[6])(pIVar8,pCVar9,pCVar7,(ulong)uVar6);
        (in_RDI->m_FavLookup).m_FavoriteIndex = local_1c;
        (in_RDI->m_FavLookup).m_LookupCount = (in_RDI->m_FavLookup).m_LookupCount + -1;
        (in_RDI->m_FavLookup).m_Active = true;
        return local_10;
      }
    }
  }
  return local_10;
}

Assistant:

const NETADDR *CServerBrowserFavorites::UpdateFavorites()
{
	NETADDR *pResult = 0;

	// check if hostname lookup for favorites is done
	if(m_FavLookup.m_Active && m_FavLookup.m_HostLookup.m_Job.Status() == CJob::STATE_DONE)
	{
		// check if favorite has not been removed in the meanwhile
		if(m_FavLookup.m_FavoriteIndex != -1)
		{
			if(m_FavLookup.m_HostLookup.m_Job.Result() == 0)
			{
				CFavoriteServer *pEntry = FindFavoriteByAddr(m_FavLookup.m_HostLookup.m_Addr, 0);
				if(pEntry)
				{
					// address is already in the list -> acquire hostname if existing entry lacks it and drop multiple address entry
					if(pEntry->m_State != FAVSTATE_HOST)
					{
						str_copy(pEntry->m_aHostname, m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_aHostname, sizeof(pEntry->m_aHostname));
						pEntry->m_State = FAVSTATE_HOST;
					}
					RemoveFavoriteEntry(m_FavLookup.m_FavoriteIndex);
				}
				else
				{
					// address wasn't in the list yet -> add it (optional check if hostname matches given address -> drop entry on fail)
					if(m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_State == FAVSTATE_LOOKUP ||
						net_addr_comp(&m_aFavoriteServers[m_NumFavoriteServers].m_Addr, &m_FavLookup.m_HostLookup.m_Addr, true) == 0)
					{
						m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_Addr = m_FavLookup.m_HostLookup.m_Addr;
						m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_State = FAVSTATE_HOST;
						pResult = &m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_Addr;
					}
					else
					{
						RemoveFavoriteEntry(m_FavLookup.m_FavoriteIndex);
					}
				}
			}
			else
			{
				// hostname lookup failed
				if(m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_State == FAVSTATE_LOOKUP)
				{
					m_aFavoriteServers[m_FavLookup.m_FavoriteIndex].m_State = FAVSTATE_INVALID;
				}
				else
				{
					RemoveFavoriteEntry(m_FavLookup.m_FavoriteIndex);
				}
			}
		}
		m_FavLookup.m_Active = false;
	}

	// add hostname lookup for favorites
	if(m_FavLookup.m_LookupCount > 0 && !m_FavLookup.m_Active)
	{
		for(int i = 0; i < m_NumFavoriteServers; i++)
		{
			if(m_aFavoriteServers[i].m_State <= FAVSTATE_LOOKUPCHECK)
			{
				m_pEngine->HostLookup(&m_FavLookup.m_HostLookup, m_aFavoriteServers[i].m_aHostname, m_pNetClient->NetType());
				m_FavLookup.m_FavoriteIndex = i;
				--m_FavLookup.m_LookupCount;
				m_FavLookup.m_Active = true;
				break;
			}
		}
	}

	return pResult;
}